

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  char cVar1;
  CornerTable *pCVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  _Bit_type _Var8;
  long lVar9;
  uint32_t j;
  uint uVar10;
  ulong uVar11;
  uint32_t num_flags;
  RAnsBitDecoder decoder;
  uint local_5c;
  MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  RAnsBitDecoder local_48;
  
  if (buffer->bitstream_version_ < 0x202) {
    lVar9 = buffer->pos_ + 1;
    if ((buffer->data_size_ < lVar9) ||
       (cVar1 = buffer->data_[buffer->pos_], buffer->pos_ = lVar9, cVar1 != '\0')) {
      return false;
    }
  }
  local_50 = this->is_crease_edge_;
  lVar9 = 0;
  local_58 = this;
  do {
    bVar6 = anon_unknown_80::DecodeVarintUnsigned<unsigned_int>(1,&local_5c,buffer);
    uVar5 = local_5c;
    if (!bVar6) {
      return false;
    }
    pCVar2 = (local_58->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ).mesh_data_.corner_table_;
    if ((uint)((ulong)((long)(pCVar2->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar2->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) < local_5c) {
      return false;
    }
    if ((ulong)local_5c != 0) {
      this_00 = local_50 + lVar9;
      std::vector<bool,_std::allocator<bool>_>::resize(this_00,(ulong)local_5c,false);
      RAnsBitDecoder::RAnsBitDecoder(&local_48);
      bVar6 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
      if (!bVar6) {
        RAnsBitDecoder::~RAnsBitDecoder(&local_48);
        return false;
      }
      uVar11 = 0;
      do {
        bVar6 = RAnsBitDecoder::DecodeNextBit(&local_48);
        p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar4 = uVar11 >> 6;
        uVar7 = 1L << ((byte)uVar11 & 0x3f);
        if (bVar6) {
          _Var8 = uVar7 | p_Var3[uVar4];
        }
        else {
          _Var8 = ~uVar7 & p_Var3[uVar4];
        }
        p_Var3[uVar4] = _Var8;
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar5 != uVar10);
      RAnsBitDecoder::~RAnsBitDecoder(&local_48);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  bVar6 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                    (&(local_58->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                      ).
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      .transform_,buffer);
  return bVar6;
}

Assistant:

bool MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Decode prediction mode.
    uint8_t mode;
    if (!buffer->Decode(&mode)) {
      return false;
    }

    if (mode != Mode::OPTIMAL_MULTI_PARALLELOGRAM) {
      // Unsupported mode.
      return false;
    }
  }
#endif

  // Encode selected edges using separate rans bit coder for each context.
  for (int i = 0; i < kMaxNumParallelograms; ++i) {
    uint32_t num_flags;
    if (!DecodeVarint<uint32_t>(&num_flags, buffer)) {
      return false;
    }
    if (num_flags > this->mesh_data().corner_table()->num_corners()) {
      return false;
    }
    if (num_flags > 0) {
      is_crease_edge_[i].resize(num_flags);
      RAnsBitDecoder decoder;
      if (!decoder.StartDecoding(buffer)) {
        return false;
      }
      for (uint32_t j = 0; j < num_flags; ++j) {
        is_crease_edge_[i][j] = decoder.DecodeNextBit();
      }
      decoder.EndDecoding();
    }
  }
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}